

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConn.cpp
# Opt level: O1

BufferChain * __thiscall TcpConn::Alloc(TcpConn *this)

{
  int iVar1;
  Poller *pPVar2;
  BufferChain *pBVar3;
  long lVar4;
  
  pPVar2 = (this->super_PollObj).m_pPoller;
  iVar1 = (pPVar2->buffPool).count_;
  lVar4 = (long)iVar1;
  if (lVar4 == 0) {
    pBVar3 = (BufferChain *)malloc(0x1000);
  }
  else {
    (pPVar2->buffPool).count_ = iVar1 + -1;
    pBVar3 = (pPVar2->buffPool).objs_._M_elems[lVar4 + -1];
    (pPVar2->buffPool).objs_._M_elems[lVar4 + -1] = (BufferChain *)0x0;
  }
  pBVar3->read = 0;
  pBVar3->write = 0;
  pBVar3->refcount = 1;
  pBVar3->nextpkt = (BufferChain *)0x0;
  return pBVar3;
}

Assistant:

BufferChain* TcpConn::Alloc()
{
    auto* bc = this->m_pPoller->BuffPool().Get();
    bc->Init();
    return bc;
}